

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_fluent.cpp
# Opt level: O0

SymbolsWrapper * __thiscall
icu_63::number::impl::SymbolsWrapper::operator=(SymbolsWrapper *this,SymbolsWrapper *src)

{
  SymbolsWrapper *src_local;
  SymbolsWrapper *this_local;
  
  if (this != src) {
    doCleanup(this);
    doMoveFrom(this,src);
  }
  return this;
}

Assistant:

SymbolsWrapper& SymbolsWrapper::operator=(SymbolsWrapper&& src) U_NOEXCEPT {
    if (this == &src) {
        return *this;
    }
    doCleanup();
    doMoveFrom(std::move(src));
    return *this;
}